

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void __thiscall Fl_Window::show(Fl_Window *this)

{
  byte bVar1;
  Fl_Image *pFVar2;
  ulong uVar3;
  
  pFVar2 = Fl::scheme_bg_;
  (this->super_Fl_Group).super_Fl_Widget.label_.image = Fl::scheme_bg_;
  if (pFVar2 != (Fl_Image *)0x0) {
    (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 0x50;
  }
  (this->super_Fl_Group).super_Fl_Widget.label_.type = pFVar2 == (Fl_Image *)0x0;
  (*Fl_Tooltip::exit)((Fl_Widget *)this);
  if (this->i == (Fl_X *)0x0) {
    fl_open_display();
    if (((this->super_Fl_Group).super_Fl_Widget.type_ != 0xf1) &&
       (bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_, bVar1 == 1 || (bVar1 & 0xf2) == 2)) {
      uVar3 = fl_xpixel((this->super_Fl_Group).super_Fl_Widget.color_);
      fl_background_pixel = (int)uVar3;
    }
    Fl_X::make_xid(this,fl_visual,fl_colormap);
    return;
  }
  XMapRaised(fl_display,this->i->xid);
  return;
}

Assistant:

void Fl_Window::show() {
  image(Fl::scheme_bg_);
  if (Fl::scheme_bg_) {
    labeltype(FL_NORMAL_LABEL);
    align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
  } else {
    labeltype(FL_NO_LABEL);
  }
  Fl_Tooltip::exit(this);
  if (!shown()) {
    fl_open_display();
    // Don't set background pixel for double-buffered windows...
    if (type() != FL_DOUBLE_WINDOW && can_boxcheat(box())) {
      fl_background_pixel = int(fl_xpixel(color()));
    }
    Fl_X::make_xid(this);
  } else {
    XMapRaised(fl_display, i->xid);
  }
#ifdef USE_PRINT_BUTTON
void preparePrintFront(void);
preparePrintFront();
#endif
}